

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,ValuePair *pair)

{
  long lVar1;
  ValueType VVar2;
  uint64_t uVar3;
  void *pvVar4;
  uint8_t *puVar5;
  Exception *this_00;
  undefined8 uVar6;
  ValuePair *in_RSI;
  uint64_t in_RDI;
  uint8_t *p;
  uint64_t size_1;
  uint64_t v;
  uint64_t size;
  ValueLength oldPos;
  size_t in_stack_ffffffffffffff78;
  Builder *in_stack_ffffffffffffff80;
  ValueLength in_stack_ffffffffffffff88;
  Builder *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar7;
  uint8_t *local_20;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  VVar2 = ValuePair::valueType(in_RSI);
  uVar7 = true;
  if (VVar2 != String) {
    VVar2 = ValuePair::valueType(in_RSI);
    uVar7 = VVar2 == UInt;
  }
  checkKeyHasValidType((Builder *)CONCAT17(uVar7,in_stack_ffffffffffffffa0),SUB81(in_RDI >> 0x38,0))
  ;
  VVar2 = ValuePair::valueType(in_RSI);
  if (VVar2 == String) {
    uVar3 = ValuePair::getSize(in_RSI);
    if (uVar3 < 0x7f) {
      reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      appendByteUnchecked(in_stack_ffffffffffffff80,(uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
    }
    else {
      reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      appendByteUnchecked(in_stack_ffffffffffffff80,(uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
      appendLengthUnchecked<8ul>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if (uVar3 != 0) {
      pvVar4 = (void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20));
      puVar5 = ValuePair::getStart(in_RSI);
      memcpy(pvVar4,puVar5,uVar3);
      advance(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    local_20 = (uint8_t *)(*(long *)(in_RDI + 0x18) + lVar1);
  }
  else {
    VVar2 = ValuePair::valueType(in_RSI);
    if (VVar2 == Binary) {
      uVar3 = ValuePair::getSize(in_RSI);
      reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      appendUInt((Builder *)CONCAT17(uVar7,in_stack_ffffffffffffffa0),in_RDI,
                 (uint8_t)((ulong)in_stack_ffffffffffffff90 >> 0x38));
      if (uVar3 != 0) {
        pvVar4 = (void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20));
        puVar5 = ValuePair::getStart(in_RSI);
        memcpy(pvVar4,puVar5,uVar3);
        advance(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      local_20 = (uint8_t *)(*(long *)(in_RDI + 0x18) + lVar1);
    }
    else {
      VVar2 = ValuePair::valueType(in_RSI);
      if (VVar2 != Custom) {
        uVar6 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff90,
                   (ExceptionType)(in_stack_ffffffffffffff88 >> 0x20),
                   (char *)in_stack_ffffffffffffff80);
        __cxa_throw(uVar6,&Exception::typeinfo,Exception::~Exception);
      }
      if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x28) & 1) != 0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_00,(ExceptionType)(in_stack_ffffffffffffff78 >> 0x20));
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      uVar3 = ValuePair::getSize(in_RSI);
      reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      puVar5 = ValuePair::getStart(in_RSI);
      if (puVar5 != (uint8_t *)0x0) {
        memcpy((void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)),puVar5,uVar3);
      }
      advance(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_20 = (uint8_t *)((*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)) - uVar3);
    }
  }
  return local_20;
}

Assistant:

uint8_t* Builder::set(ValuePair const& pair) {
  // This method builds a single further VPack item at the current
  // append position. This is the case for ValueType::String,
  // ValueType::Binary, or ValueType::Custom, which can be built
  // with two pieces of information

  auto const oldPos = _pos;

  checkKeyHasValidType(pair.valueType() == ValueType::String ||
                       pair.valueType() == ValueType::UInt);

  if (pair.valueType() == ValueType::String) {
    uint64_t size = pair.getSize();
    if (size > 126) {
      // long string
      reserve(1 + 8 + size);
      appendByteUnchecked(0xbf);
      appendLengthUnchecked<8>(size);
    } else {
      // short string
      reserve(1 + size);
      appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
    }
    if (size != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(size));
      advance(size);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Binary) {
    uint64_t v = pair.getSize();
    reserve(9 + v);
    appendUInt(v, 0xbf);
    if (v != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(v));
      advance(v);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Custom) {
    if (options->disallowCustom) {
      // Custom values explicitly disallowed as a security precaution
      throw Exception(Exception::BuilderCustomDisallowed);
    }
    // We only reserve space here, the caller has to fill in the custom type
    uint64_t size = pair.getSize();
    reserve(size);
    uint8_t const* p = pair.getStart();
    if (p != nullptr) {
      std::memcpy(_start + _pos, p, checkOverflow(size));
    }
    advance(size);
    return _start + _pos - size;
  }
  throw Exception(Exception::BuilderUnexpectedType,
                  "Only ValueType::Binary, ValueType::String and "
                  "ValueType::Custom are valid for ValuePair argument");
}